

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void objindx(mcmcxdef *mctx,objnum objn)

{
  ushort *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uchar *puVar5;
  uint uVar6;
  uint16_t tmp;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  undefined6 in_register_00000032;
  uint uVar10;
  byte *__dest;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  byte *__src;
  bool bVar16;
  ushort need;
  ushort local_52;
  ulong local_50;
  ulong local_48;
  mcmcxdef *local_40;
  uchar *local_38;
  
  puVar5 = mcmlck(mctx,objn);
  uVar4 = *(ushort *)(puVar5 + 6);
  uVar14 = (uint)uVar4;
  local_48 = (CONCAT62(in_register_00000032,objn) & 0xffffffff) >> 8;
  local_50 = (ulong)((uint)CONCAT62(in_register_00000032,objn) & 0xff);
  uVar10 = (uint)*(ushort *)
                  ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[local_48][local_50] >> 8]->mcmosiz
                  + (ulong)((mctx->mcmcxmtb[local_48][local_50] & 0xff) << 5)) -
           (uint)*(ushort *)(puVar5 + 8);
  local_40 = mctx;
  if (uVar10 < (uint)uVar4 * 4 + 2) {
    local_52 = (uVar4 * 4 - (short)uVar10) + 0x2a;
    puVar5 = objexp(mctx,objn,&local_52);
  }
  pbVar9 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2 + 0xe;
  if (uVar4 != 0) {
    pbVar15 = puVar5 + *(ushort *)(puVar5 + 8);
    iVar8 = 0;
    uVar10 = 0;
    local_38 = puVar5;
    do {
      __dest = pbVar15;
      if (uVar10 != 0) {
        uVar7 = uVar10 - 1;
        bVar2 = *pbVar9;
        uVar12 = 0;
        do {
          uVar11 = uVar12;
          uVar6 = uVar7 - uVar11 >> 1;
          uVar13 = uVar6 + uVar11;
          __dest = pbVar15 + uVar13 * 4;
          bVar3 = pbVar15[uVar13 * 4];
          if ((bVar3 == bVar2) && (__dest[1] == pbVar9[1])) break;
          if ((bVar3 < bVar2) || ((bVar3 == bVar2 && (__dest[1] < pbVar9[1])))) {
            uVar12 = uVar11 + 1;
            if (1 < uVar7 - uVar11) {
              uVar12 = uVar13;
            }
          }
          else {
            bVar16 = uVar13 != uVar7;
            uVar7 = uVar7 - 1;
            uVar12 = uVar11;
            if (bVar16) {
              uVar7 = uVar13;
            }
          }
        } while (uVar12 <= uVar7);
        if (uVar13 < uVar10) {
          uVar7 = iVar8 + (uVar6 + uVar11) * -4;
          __src = __dest;
          do {
            __dest = __src + 4;
            if (*pbVar9 < *__src) {
              memmove(__dest,__src,(ulong)uVar7);
              puVar5 = local_38;
              __dest = __src;
              break;
            }
            uVar13 = uVar13 + 1;
            uVar7 = uVar7 - 4;
            __src = __dest;
          } while (uVar13 < uVar10);
        }
      }
      *__dest = *pbVar9;
      __dest[1] = pbVar9[1];
      *(short *)(__dest + 2) = (short)pbVar9 - (short)puVar5;
      pbVar9 = pbVar9 + (ulong)*(ushort *)(pbVar9 + 3) + 6;
      uVar10 = uVar10 + 1;
      iVar8 = iVar8 + 4;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  puVar5[2] = puVar5[2] | 2;
  puVar1 = &local_40->mcmcxgl->mcmcxtab[local_40->mcmcxmtb[local_48][local_50] >> 8]
            [(byte)local_40->mcmcxmtb[local_48][local_50]].mcmoflg;
  *puVar1 = *puVar1 | 1;
  mcmunlck(local_40,objn);
  return;
}

Assistant:

void objindx(mcmcxdef *mctx, objnum objn)
{
    uint    newsiz;
    uint    avail;
    objdef *objptr;
    uint    cnt;
    prpdef *p;
    uchar  *indp;
    uchar  *indbase;
    uint    icnt;
    uint    first;
    uint    last;
    uint    cur;
    
    objptr = (objdef *)mcmlck(mctx, objn);            /* get object pointer */
    cnt = objnprop(objptr);                     /* get number of properties */
    p = objprp(objptr);         /* get pointer to properties (or old index) */
    newsiz = 2 + 4*cnt;                 /* figure size needed for the index */
    
    avail = mcmobjsiz(mctx, objn) - objfree(objptr);
    
    /* insert space for the index; expand the object if necessary */
    if (avail < newsiz)
    {
        ushort  need;
        
        newsiz += 10*4;                   /* add some extra space for later */
        need = newsiz - avail;            /* compute amount of space needed */
        objptr = objexp(mctx, objn, &need);
        p = objprp(objptr);
    }
    
    /* now build the index */
    indbase = objpfre(objptr);
    for (icnt = 0 ; cnt ; p = objpnxt(p), --cnt, ++icnt)
    {
        uint ofs = (uchar *)p - (uchar *)objptr;
        
        if (icnt)
        {
            /* figure out where to insert this property */
            first = 0;
            last = icnt - 1;
            for (;;)
            {
                if (first > last) break;
                cur = first + (last - first)/2;
                indp = indbase + cur*4;
                if (indp[0] == p[0] && indp[1] == p[1])
                    break;
                else if (indp[0] < p[0]
                         || (indp[0] == p[0] && indp[1] < p[1]))
                    first = (cur == first ? first + 1 : cur);
                else
                    last = (cur == last ? last - 1 : cur);
            }
            
            /* make sure we're positioned just before insertion point */
            while (cur < icnt
                   && (indp[0] <= p[0]
                       || (indp[0] == p[0] && indp[1] <= p[1])))
            {
                indp += 4;
                ++cur;
            }
                
            /* move elements above if any */
            if (cur < icnt)
                memmove(indp + 4, indp, (size_t)((icnt - cur) * 4));
        }
        else
            indp = indbase;
        
        /* insert property into index */
        indp[0] = p[0];
        indp[1] = p[1];
        oswp2(indp+2, ofs);
    }
    
    /* set the index flag, and dirty and free the object */
    objsflg(objptr, objflg(objptr) | OBJFINDEX);
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
}